

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Str_t *
Acb_GeneratePatch(Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,Vec_Ptr_t *vSops,Vec_Ptr_t *vGias,
                 Vec_Int_t *vTars)

{
  char cVar1;
  void **ppvVar2;
  void *__ptr;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vec_Ptr_t *__ptr_00;
  Vec_Str_t *p_00;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  char *pcVar14;
  Vec_Wec_t *pVVar15;
  uint uVar16;
  int i;
  uint nNodes;
  uint uVar17;
  int i_3;
  ulong uVar18;
  size_t sVar19;
  bool bVar20;
  int i_8;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int local_e4;
  int local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8;
  Vec_Wec_t *local_b8;
  uint local_ac;
  int nGates1 [5];
  uint local_6c;
  
  if (vGias == (Vec_Ptr_t *)0x0) {
    local_b8 = Abc_SopSynthesize(vSops);
    vGias = vSops;
  }
  else {
    local_b8 = Abc_GiaSynthesize(vGias,(Gia_Man_t *)0x0);
  }
  local_ac = vGias->nSize;
  nNodes = local_b8->nSize - (vUsed->nSize + local_ac);
  nGates1[4] = 0;
  nGates1[0] = 0;
  nGates1[1] = 0;
  nGates1[2] = 0;
  nGates1[3] = 0;
  local_6c = 0;
  local_c8 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  __ptr_00 = Acb_GenerateSignalNames(p,vDivs,vUsed,nNodes,vTars,local_b8);
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pcVar9 = (char *)malloc(100);
  p_00->pArray = pcVar9;
  pVVar10 = Acb_GetUsedDivs(vDivs,vUsed);
  vObjsDerefed = Acb_GetDerefedNodes(p);
  pVVar11 = Acb_ObjCollectTfiVec(p,pVVar10);
  pVVar12 = Acb_ObjCollectTfoVec(p,vTars);
  uVar3 = Acb_NtkCountPiBuffers(p,pVVar10);
  uVar4 = Acb_NtkCountPoDrivers(p,vTars);
  if (vObjsDerefed != (Vec_Int_t *)0x0) {
    iVar8 = vTars->nSize;
    iVar5 = Acb_NtkFindMffcSize(p,pVVar10,vObjsDerefed,nGates1);
    local_6c = iVar5 + iVar8;
  }
  lVar21 = 0;
  piVar13 = Abc_FrameReadGateCounts();
  do {
    nGates1[lVar21] = nGates1[lVar21] + piVar13[lVar21];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  if (pVVar10 != (Vec_Int_t *)0x0) {
    free(pVVar10);
  }
  uVar16 = vUsed->nSize;
  if (0 < (int)nNodes) {
    local_e0 = (int)uStack_d0;
    local_e4 = uStack_d0._4_4_;
    uVar18 = (ulong)uVar16 << 4 | 8;
    pVVar15 = local_b8;
    uVar17 = uVar16;
    uVar7 = local_c8;
    do {
      if (((int)uVar16 < 0) || (pVVar15->nSize <= (int)uVar17)) {
        uStack_d0 = CONCAT44(local_e4,local_e0);
        local_c8 = uVar7;
        goto LAB_0039956d;
      }
      pVVar10 = pVVar15->pArray;
      iVar8 = *(int *)((long)pVVar10 + (uVar18 - 4));
      if (iVar8 < 3) {
        if (iVar8 < 1) {
          uStack_d0 = CONCAT44(local_e4,local_e0);
          local_c8 = uVar7;
          goto LAB_003995dd;
        }
        piVar13 = (int *)((long)&local_d8 +
                         (ulong)(**(int **)((long)&pVVar10->nCap + uVar18) == 8) * 4);
        *piVar13 = *piVar13 + 1;
      }
      else {
        uVar6 = **(int **)((long)&pVVar10->nCap + uVar18) - 7;
        if ((0xb < uVar6) || ((0xff3U >> (uVar6 & 0x1f) & 1) == 0)) {
          uStack_d0 = CONCAT44(local_e4,local_e0);
          local_c8 = uVar7;
          goto LAB_003995a5;
        }
        pcVar9 = (&PTR_anon_var_dwarf_b9ab5_00bb2190)[uVar6];
        iVar5 = strcmp(pcVar9,"buf");
        if (iVar5 == 0) {
          local_e0 = local_e0 + 1;
          pVVar15 = local_b8;
        }
        else {
          iVar5 = strcmp(pcVar9,"not");
          pVVar15 = local_b8;
          if (iVar5 == 0) {
            local_e4 = local_e4 + 1;
          }
          else {
            uVar7 = (uVar7 + iVar8) - 3;
          }
        }
      }
      uVar17 = uVar17 + 1;
      uVar18 = uVar18 + 0x10;
    } while ((int)uVar17 < (int)(uVar16 + nNodes));
    uStack_d0 = CONCAT44(local_e4,local_e0);
    local_c8 = uVar7;
  }
  Vec_StrPrintF(p_00,
                "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
                (ulong)uVar16,(ulong)local_ac,(ulong)uVar3,(ulong)uVar4,(ulong)(uint)pVVar11->nSize,
                (ulong)(uint)pVVar12->nSize);
  uVar17 = local_c8;
  iVar8 = (int)local_d8;
  uVar16 = local_d8._4_4_;
  iVar5 = (int)uStack_d0;
  uVar7 = uStack_d0._4_4_;
  Vec_StrPrintF(p_00,
                "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                (ulong)nNodes,local_d8 & 0xffffffff,(ulong)local_d8._4_4_,uStack_d0 & 0xffffffff,
                (ulong)uStack_d0._4_4_,(ulong)local_c8);
  if (vObjsDerefed != (Vec_Int_t *)0x0) {
    Vec_StrPrintF(p_00,
                  "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)local_6c,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
                  nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
    Vec_StrPrintF(p_00,
                  "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)(nNodes - local_6c),(ulong)(uint)(iVar8 - nGates1[0]),
                  (ulong)(uVar16 - nGates1[1]),(ulong)(uint)(iVar5 - nGates1[2]),
                  (ulong)(uVar7 - nGates1[3]),(ulong)(uVar17 - nGates1[4]));
  }
  lVar21 = 0;
  Vec_StrPrintF(p_00,"\n");
  do {
    cVar1 = "module patch ("[lVar21];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00398839;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00398839:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0xe);
  if (vTars->nSize != local_ac) {
    __assert_fail("Vec_IntSize(vTars) == nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x7c7,
                  "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  if (0 < vTars->nSize) {
    lVar21 = 0;
    do {
      iVar8 = vTars->pArray[lVar21];
      pcVar9 = ",";
      if (lVar21 == 0) {
        pcVar9 = "";
      }
      if ((long)iVar8 < 1) goto LAB_00399535;
      iVar5 = (p->vObjName).nSize;
      if (iVar5 < 1) goto LAB_00399516;
      if (iVar5 <= iVar8) goto LAB_003995dd;
      pcVar14 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar8]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar14);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vTars->nSize);
  }
  if (0 < vUsed->nSize) {
    lVar21 = 0;
    do {
      iVar8 = vUsed->pArray[lVar21];
      if (((long)iVar8 < 0) || (vDivs->nSize <= iVar8)) goto LAB_003995dd;
      iVar8 = vDivs->pArray[iVar8];
      if ((long)iVar8 < 1) goto LAB_00399535;
      iVar5 = (p->vObjName).nSize;
      if (iVar5 < 1) goto LAB_00399516;
      if (iVar5 <= iVar8) goto LAB_003995dd;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar8]);
      Vec_StrPrintF(p_00,", %s",pcVar9);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vUsed->nSize);
  }
  lVar21 = 0;
  do {
    cVar1 = "\n  );\n\n"[lVar21 + 2];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_003989fa;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_003989fa:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  lVar21 = 0;
  do {
    cVar1 = "  output"[lVar21];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00398a88;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00398a88:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 8);
  if (0 < vTars->nSize) {
    lVar21 = 0;
    do {
      iVar8 = vTars->pArray[lVar21];
      pcVar9 = ",";
      if (lVar21 == 0) {
        pcVar9 = "";
      }
      if ((long)iVar8 < 1) goto LAB_00399535;
      iVar5 = (p->vObjName).nSize;
      if (iVar5 < 1) goto LAB_00399516;
      if (iVar5 <= iVar8) goto LAB_003995dd;
      pcVar14 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar8]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar14);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vTars->nSize);
  }
  lVar21 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar21 + 0xb];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00398ba5;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00398ba5:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 2);
  lVar21 = 0;
  do {
    cVar1 = "  input"[lVar21];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00398c34;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00398c34:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 7);
  if (0 < vUsed->nSize) {
    lVar21 = 0;
    do {
      iVar8 = vUsed->pArray[lVar21];
      if (((long)iVar8 < 0) || (vDivs->nSize <= iVar8)) goto LAB_003995dd;
      iVar8 = vDivs->pArray[iVar8];
      pcVar9 = ",";
      if (lVar21 == 0) {
        pcVar9 = "";
      }
      if ((long)iVar8 < 1) {
LAB_00399535:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar5 = (p->vObjName).nSize;
      if (iVar5 < 1) {
LAB_00399516:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (iVar5 <= iVar8) goto LAB_003995dd;
      pcVar14 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar8]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar14);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vUsed->nSize);
  }
  lVar21 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar21 + 0xb];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00398d70;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00398d70:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 2);
  if ((int)local_ac < (int)nNodes) {
    lVar21 = 0;
    do {
      cVar1 = "  wire"[lVar21];
      uVar16 = p_00->nCap;
      if (p_00->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,0x10);
          }
          sVar19 = 0x10;
        }
        else {
          sVar19 = (ulong)uVar16 * 2;
          if ((int)sVar19 <= (int)uVar16) goto LAB_00398e0c;
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar19);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,sVar19);
          }
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar19;
      }
LAB_00398e0c:
      iVar8 = p_00->nSize;
      p_00->nSize = iVar8 + 1;
      p_00->pArray[iVar8] = cVar1;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 6);
    if (0 < (int)nNodes) {
      bVar20 = true;
      uVar16 = 0;
      do {
        uVar7 = vUsed->nSize + uVar16;
        if (((int)uVar7 < 0) || (__ptr_00->nSize <= (int)uVar7)) goto LAB_003994f7;
        pcVar9 = (char *)__ptr_00->pArray[uVar7];
        iVar8 = strncmp(pcVar9,"ww",2);
        if (iVar8 == 0) {
          pcVar14 = "";
          if (!bVar20) {
            pcVar14 = ",";
          }
          bVar20 = false;
          Vec_StrPrintF(p_00,"%s %s",pcVar14,pcVar9);
        }
        uVar16 = uVar16 + 1;
      } while (nNodes != uVar16);
    }
    lVar21 = 0;
    do {
      cVar1 = "\n);\n\n"[lVar21 + 2];
      uVar16 = p_00->nCap;
      if (p_00->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,0x10);
          }
          sVar19 = 0x10;
        }
        else {
          sVar19 = (ulong)uVar16 * 2;
          if ((int)sVar19 <= (int)uVar16) goto LAB_00398f2a;
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar19);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,sVar19);
          }
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar19;
      }
LAB_00398f2a:
      iVar8 = p_00->nSize;
      p_00->nSize = iVar8 + 1;
      p_00->pArray[iVar8] = cVar1;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
  }
  if (0 < (int)nNodes) {
    uVar16 = vUsed->nSize;
    uVar18 = (ulong)uVar16;
    do {
      if (((int)uVar16 < 0) || (local_b8->nSize <= (int)uVar18)) {
LAB_0039956d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar10 = local_b8->pArray;
      if (pVVar10[uVar18].nSize < 3) {
        if (pVVar10[uVar18].nSize < 1) {
LAB_003995dd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (1 < *pVVar10[uVar18].pArray - 7U) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x7f0,
                        "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                       );
        }
        Vec_StrPrintF(p_00,"  %s (","buf");
        if (pVVar10[uVar18].nSize < 2) goto LAB_003995dd;
        iVar8 = pVVar10[uVar18].pArray[1];
        if (((long)iVar8 < 0) || (__ptr_00->nSize <= iVar8)) {
LAB_003994f7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Vec_StrPrintF(p_00," %s, ",__ptr_00->pArray[iVar8]);
        if (pVVar10[uVar18].nSize < 1) goto LAB_003995dd;
        Vec_StrPrintF(p_00," 1\'b%d",(ulong)(*pVVar10[uVar18].pArray == 8));
        Vec_StrPrintF(p_00," );\n");
      }
      else {
        uVar7 = *pVVar10[uVar18].pArray - 7;
        if ((0xb < uVar7) || ((0xff3U >> (uVar7 & 0x1f) & 1) == 0)) {
LAB_003995a5:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x66,"char *Acb_Oper2Name(int)");
        }
        Vec_StrPrintF(p_00,"  %s (",(&PTR_anon_var_dwarf_b9ab5_00bb2190)[uVar7]);
        if (1 < pVVar10[uVar18].nSize) {
          uVar22 = 1;
          do {
            iVar8 = pVVar10[uVar18].pArray[uVar22];
            pcVar9 = "";
            if (1 < uVar22) {
              pcVar9 = ",";
            }
            if (((long)iVar8 < 0) || (__ptr_00->nSize <= iVar8)) goto LAB_003994f7;
            Vec_StrPrintF(p_00,"%s %s",pcVar9,__ptr_00->pArray[iVar8]);
            uVar22 = uVar22 + 1;
          } while ((long)uVar22 < (long)pVVar10[uVar18].nSize);
        }
        lVar21 = 0;
        do {
          cVar1 = "\n  );\n"[lVar21 + 2];
          uVar7 = p_00->nCap;
          if (p_00->nSize == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar7 * 2;
              if ((int)sVar19 <= (int)uVar7) goto LAB_003990b2;
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar19);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,sVar19);
              }
            }
            p_00->pArray = pcVar9;
            p_00->nCap = (int)sVar19;
          }
LAB_003990b2:
          iVar8 = p_00->nSize;
          p_00->nSize = iVar8 + 1;
          p_00->pArray[iVar8] = cVar1;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
      }
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < (int)(vUsed->nSize + nNodes));
  }
  lVar21 = 0;
  do {
    cVar1 = "\nendmodule\n\n"[lVar21];
    uVar16 = p_00->nCap;
    if (p_00->nSize == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar16 * 2;
        if ((int)sVar19 <= (int)uVar16) goto LAB_00399203;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar19);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar19);
        }
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar19;
    }
LAB_00399203:
    iVar8 = p_00->nSize;
    p_00->nSize = iVar8 + 1;
    p_00->pArray[iVar8] = cVar1;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0xc);
  uVar16 = p_00->nCap;
  if (p_00->nSize == uVar16) {
    if ((int)uVar16 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar19 = 0x10;
    }
    else {
      sVar19 = (ulong)uVar16 * 2;
      if ((int)sVar19 <= (int)uVar16) goto LAB_00399294;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar19);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar19);
      }
    }
    p_00->pArray = pcVar9;
    p_00->nCap = (int)sVar19;
  }
LAB_00399294:
  iVar8 = p_00->nSize;
  p_00->nSize = iVar8 + 1;
  p_00->pArray[iVar8] = '\0';
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    iVar8 = __ptr_00->nSize;
    if (0 < (long)iVar8) {
      ppvVar2 = __ptr_00->pArray;
      lVar21 = 0;
      do {
        if ((void *)0x2 < ppvVar2[lVar21]) {
          free(ppvVar2[lVar21]);
        }
        lVar21 = lVar21 + 1;
      } while (iVar8 != lVar21);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    free(__ptr_00);
  }
  pVVar15 = local_b8;
  if (0 < local_b8->nCap) {
    lVar21 = 8;
    lVar23 = 0;
    do {
      __ptr = *(void **)((long)&pVVar15->pArray->nCap + lVar21);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&local_b8->pArray->nCap + lVar21) = 0;
        pVVar15 = local_b8;
      }
      lVar23 = lVar23 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar23 < pVVar15->nCap);
  }
  if (pVVar15->pArray != (Vec_Int_t *)0x0) {
    free(pVVar15->pArray);
    local_b8->pArray = (Vec_Int_t *)0x0;
    pVVar15 = local_b8;
  }
  pVVar15->nCap = 0;
  pVVar15->nSize = 0;
  free(pVVar15);
  putchar(10);
  printf("Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
         (ulong)(uint)vUsed->nSize,(ulong)local_ac,(ulong)uVar3,(ulong)uVar4,
         (ulong)(uint)pVVar11->nSize,(ulong)(uint)pVVar12->nSize);
  uVar16 = local_c8;
  uVar3 = local_d8._4_4_;
  iVar8 = (int)uStack_d0;
  uVar4 = uStack_d0._4_4_;
  local_b8 = (Vec_Wec_t *)CONCAT44(local_b8._4_4_,(int)local_d8);
  printf("Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
         (ulong)nNodes,local_d8 & 0xffffffff,(ulong)local_d8._4_4_,uStack_d0 & 0xffffffff,
         (ulong)uStack_d0._4_4_,(ulong)local_c8);
  if (vObjsDerefed == (Vec_Int_t *)0x0) {
    putchar(10);
  }
  else {
    printf("Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
           (ulong)local_6c,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
           nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
    printf("TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
           (ulong)(nNodes - local_6c),(ulong)(uint)((int)local_b8 - nGates1[0]),
           (ulong)(uVar3 - nGates1[1]),(ulong)(uint)(iVar8 - nGates1[2]),(ulong)(uVar4 - nGates1[3])
           ,(ulong)(uVar16 - nGates1[4]));
    putchar(10);
    if (vObjsDerefed->pArray != (int *)0x0) {
      free(vObjsDerefed->pArray);
      vObjsDerefed->pArray = (int *)0x0;
    }
    free(vObjsDerefed);
  }
  return p_00;
}

Assistant:

Vec_Str_t * Acb_GeneratePatch( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, Vec_Ptr_t * vSops, Vec_Ptr_t * vGias, Vec_Int_t * vTars )
{
    extern Vec_Wec_t * Abc_SopSynthesize( Vec_Ptr_t * vSops );
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = vGias ? Abc_GiaSynthesize(vGias, NULL) : Abc_SopSynthesize(vSops);  Vec_Int_t * vGate;
    int nOuts = vGias ? Vec_PtrSize(vGias) : Vec_PtrSize(vSops);
    int i, k, iObj, nWires = Vec_WecSize(vGates) - Vec_IntSize(vUsed) - nOuts, fFirst = 1;
    int nGates1[5] = {0}, nGates0[5] = {0};
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames( p, vDivs, vUsed, nWires, vTars, vGates );
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_Int_t * vSup = Acb_GetUsedDivs( vDivs, vUsed );
    Vec_Int_t * vDrf = Acb_GetDerefedNodes( p );
    Vec_Int_t * vTfi = Acb_ObjCollectTfiVec( p, vSup );
    Vec_Int_t * vTfo = Acb_ObjCollectTfoVec( p, vTars );
    int nPiCount = Acb_NtkCountPiBuffers( p, vSup );
    int nPoCount = Acb_NtkCountPoDrivers( p, vTars );
    int nMffc    = vDrf ? Vec_IntSize(vTars) + Acb_NtkFindMffcSize( p, vSup, vDrf, nGates1 ) : 0;
    int * pCounts = Abc_FrameReadGateCounts();
    for ( i = 0; i < 5; i++ )
        nGates1[i] += pCounts[i];
    Vec_IntFree( vSup );
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            char * pName = Acb_Oper2Name(Vec_IntEntry(vGate, 0));
            if ( !strcmp(pName, "buf") )
                nGates0[2]++;
            else if ( !strcmp(pName, "not") )
                nGates0[3]++;
            else
                nGates0[4] += Vec_IntSize(vGate) - 3;
        }
        else
            nGates0[Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T]++;
    }

    Vec_StrPrintF( vStr, "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    Vec_StrPrintF( vStr, "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc, nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    Vec_StrPrintF( vStr, "\n" );

    Vec_StrAppend( vStr, "module patch (" );

    assert( Vec_IntSize(vTars) == nOuts );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, ", %s", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, Vec_IntSize(vUsed)+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

//    printf( "Synthesized patch with %d inputs, %d outputs and %d gates (const = %d  buf = %d  inv = %d  other = %d).\n", 
//        Vec_IntSize(vUsed), nOuts, nWires, nConst, nBufs, nInvs, nNodes );
//    printf( "Summary of the results\n" );
    printf( "\n" );
    printf( "Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    printf( "Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    printf( "Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    printf( "TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc,   nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    printf( "\n" );
    Vec_IntFreeP( &vDrf );
    return vStr;
}